

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<>(char *fmt)

{
  char *in_stack_ffffffffffffffb8;
  FileLoc *loc;
  char *in_stack_ffffffffffffffd8;
  
  loc = (FileLoc *)&stack0xffffffffffffffd8;
  StringPrintf<>(in_stack_ffffffffffffffd8);
  std::__cxx11::string::c_str();
  ErrorExit(loc,in_stack_ffffffffffffffb8);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}